

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmcode.h
# Opt level: O2

void __thiscall
assembler::asmcode::add<assembler::asmcode::operation,char_const(&)[26]>
          (asmcode *this,operation *val,char (*val_1) [26])

{
  operation oVar1;
  instruction ins;
  allocator<char> local_71;
  string local_70 [32];
  undefined1 local_50 [64];
  
  oVar1 = *val;
  std::__cxx11::string::string<std::allocator<char>>(local_70,*val_1,&local_71);
  assembler::asmcode::instruction::instruction((instruction *)local_50,oVar1,local_70);
  std::__cxx11::string::~string(local_70);
  std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>::
  push_back((vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>
             *)(*(long *)(*(long *)(this + 0x20) + -8) + 0x10),(value_type *)local_50);
  std::__cxx11::string::~string((string *)(local_50 + 0x20));
  return;
}

Assistant:

void add(T&&... val)
      {
      instruction ins(std::forward<T>(val)...);
      (*instructions_list_stack.back()).push_back(ins);
      }